

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O1

double __thiscall
imrt::ApertureILS::improvementIntensity
          (ApertureILS *this,int beamlet,Station *station,bool open_beamlet,double c_eval,Plan *P,
          bool best_improvement)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  size_t *psVar6;
  undefined7 in_register_00000009;
  ulong uVar7;
  undefined3 in_register_00000089;
  _List_node_base *p_Var8;
  int iVar9;
  ulong uVar10;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_c0;
  _List_node_base local_a8;
  size_t local_98 [2];
  Station *local_88;
  _List_node_base *local_80;
  undefined4 local_78;
  int local_74;
  double local_70;
  Plan *local_68;
  undefined4 local_60;
  uint local_5c;
  ApertureILS *local_58;
  ulong local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_60 = CONCAT31(in_register_00000089,best_improvement);
  local_78 = (undefined4)CONCAT71(in_register_00000009,open_beamlet);
  local_c0.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl._M_node._M_size = 0;
  local_c0.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_c0;
  local_c0.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_c0;
  local_88 = station;
  local_70 = c_eval;
  local_68 = P;
  local_58 = this;
  Station::getOpen((vector<int,_std::allocator<int>_> *)&local_a8,station,beamlet);
  p_Var8 = local_a8._M_next;
  local_80 = local_a8._M_next;
  if ((long)local_a8._M_prev - (long)local_a8._M_next == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[NOPT] ",7);
  }
  else {
    uVar10 = (long)local_a8._M_prev - (long)local_a8._M_next >> 2;
    iVar5 = rand();
    uVar7 = (ulong)(long)iVar5 % uVar10;
    local_48 = -1.0;
    uStack_40 = 0;
    bVar4 = true;
    iVar5 = 0;
    local_50 = uVar10;
    do {
      iVar9 = (int)uVar7;
      if ((char)local_78 == '\0') {
        Station::modifyIntensityAperture_abi_cxx11_
                  ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   &local_a8,local_88,*(int *)((long)&p_Var8->_M_next + (long)iVar9 * 4),
                   (double)-local_58->step_intensity);
        p_Var8 = local_c0.
                 super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
                 _M_impl._M_node.super__List_node_base._M_next;
        while (p_Var8 != (_List_node_base *)&local_c0) {
          p_Var1 = p_Var8->_M_next;
          operator_delete(p_Var8);
          p_Var8 = p_Var1;
        }
        local_c0.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node._M_size = 0;
        if (local_a8._M_next == &local_a8) {
          psVar6 = &local_c0.
                    super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl._M_node._M_size;
          local_c0.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node.super__List_node_base._M_next = (_List_node_base *)&local_c0;
          local_c0.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_c0;
        }
        else {
          (local_a8._M_prev)->_M_next = (_List_node_base *)&local_c0;
          (local_a8._M_next)->_M_prev = (_List_node_base *)&local_c0;
          local_c0.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node._M_size = local_98[0];
          psVar6 = local_98;
          local_c0.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node.super__List_node_base._M_next = local_a8._M_next;
          local_c0.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node.super__List_node_base._M_prev = local_a8._M_prev;
          local_a8._M_next = &local_a8;
          local_a8._M_prev = &local_a8;
        }
        *psVar6 = 0;
        p_Var8 = local_a8._M_next;
        while (p_Var8 != &local_a8) {
          p_Var1 = p_Var8->_M_next;
          operator_delete(p_Var8);
          p_Var8 = p_Var1;
        }
      }
      else {
        Station::modifyIntensityAperture_abi_cxx11_
                  ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   &local_a8,local_88,*(int *)((long)&p_Var8->_M_next + (long)iVar9 * 4),
                   (double)local_58->step_intensity);
        p_Var8 = local_c0.
                 super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
                 _M_impl._M_node.super__List_node_base._M_next;
        while (p_Var8 != (_List_node_base *)&local_c0) {
          p_Var1 = (((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                     )&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          operator_delete(p_Var8);
          p_Var8 = p_Var1;
        }
        local_c0.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node._M_size = 0;
        if (local_a8._M_next == &local_a8) {
          psVar6 = &local_c0.
                    super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl._M_node._M_size;
          local_c0.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node.super__List_node_base._M_next = (_List_node_base *)&local_c0;
          local_c0.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_c0;
        }
        else {
          (local_a8._M_prev)->_M_next = (_List_node_base *)&local_c0;
          (local_a8._M_next)->_M_prev = (_List_node_base *)&local_c0;
          local_c0.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node._M_size = local_98[0];
          psVar6 = local_98;
          local_c0.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node.super__List_node_base._M_next = local_a8._M_next;
          local_c0.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node.super__List_node_base._M_prev = local_a8._M_prev;
          local_a8._M_next = &local_a8;
          local_a8._M_prev = &local_a8;
        }
        *psVar6 = 0;
        p_Var8 = local_a8._M_next;
        while (p_Var8 != &local_a8) {
          p_Var1 = p_Var8->_M_next;
          operator_delete(p_Var8);
          p_Var8 = p_Var1;
        }
      }
      p_Var8 = local_80;
      local_70 = Plan::incremental_eval(local_68,local_88,&local_c0);
      local_5c = -(uint)(local_48 - local_70 <= 1e-05 && 0.0 <= local_48);
      if ((local_5c & 1) == 0) {
        uStack_40 = 0;
        local_74 = iVar9;
        local_48 = local_70;
      }
      if ((((byte)local_5c | (byte)local_60) & 1) == 0) goto LAB_00124ec9;
      Station::undoLast_abi_cxx11_
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_a8
                 ,local_88);
      p_Var8 = local_c0.
               super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl._M_node.super__List_node_base._M_next;
      while (p_Var8 != (_List_node_base *)&local_c0) {
        p_Var1 = p_Var8->_M_next;
        operator_delete(p_Var8);
        p_Var8 = p_Var1;
      }
      local_c0.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node._M_size = 0;
      if (local_a8._M_next == &local_a8) {
        psVar6 = &local_c0.
                  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl._M_node._M_size;
        local_c0.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_c0;
        local_c0.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_c0;
      }
      else {
        (local_a8._M_prev)->_M_next = (_List_node_base *)&local_c0;
        (local_a8._M_next)->_M_prev = (_List_node_base *)&local_c0;
        local_c0.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node._M_size = local_98[0];
        psVar6 = local_98;
        local_c0.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_next = local_a8._M_next;
        local_c0.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_prev = local_a8._M_prev;
        local_a8._M_next = &local_a8;
        local_a8._M_prev = &local_a8;
      }
      *psVar6 = 0;
      p_Var1 = local_a8._M_next;
      p_Var8 = local_80;
      while (local_80 = p_Var8, p_Var1 != &local_a8) {
        p_Var8 = p_Var1->_M_next;
        operator_delete(p_Var1);
        p_Var1 = p_Var8;
        p_Var8 = local_80;
      }
      if (local_c0.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node._M_size != 0) {
        Plan::incremental_eval(local_68,local_88,&local_c0);
      }
      iVar5 = iVar5 + 1;
      if ((local_5c & 1) == 0) {
        iVar5 = 1;
      }
      uVar3 = iVar9 + 1U;
      if (local_50 == (long)(int)(iVar9 + 1U)) {
        uVar3 = 0;
      }
      uVar7 = (ulong)uVar3;
      if (local_50 == (long)iVar5) {
        bVar4 = false;
      }
    } while (bVar4);
    if ((char)local_78 == '\0') {
      Station::modifyIntensityAperture_abi_cxx11_
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_a8
                 ,local_88,*(int *)((long)&p_Var8->_M_next + (long)local_74 * 4),1.0);
      p_Var1 = local_c0.
               super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl._M_node.super__List_node_base._M_next;
      while (p_Var1 != (_List_node_base *)&local_c0) {
        p_Var2 = p_Var1->_M_next;
        operator_delete(p_Var1);
        p_Var1 = p_Var2;
      }
      local_c0.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node._M_size = 0;
      if (local_a8._M_next == &local_a8) {
        psVar6 = &local_c0.
                  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl._M_node._M_size;
        local_c0.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_c0;
        local_c0.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_c0;
      }
      else {
        psVar6 = local_98;
        (local_a8._M_prev)->_M_next = (_List_node_base *)&local_c0;
        (local_a8._M_next)->_M_prev = (_List_node_base *)&local_c0;
        local_c0.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node._M_size = local_98[0];
        local_c0.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_next = local_a8._M_next;
        local_c0.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_prev = local_a8._M_prev;
        local_a8._M_next = &local_a8;
        local_a8._M_prev = &local_a8;
      }
      *psVar6 = 0;
      p_Var1 = local_a8._M_next;
      while (p_Var1 != &local_a8) {
        p_Var2 = p_Var1->_M_next;
        operator_delete(p_Var1);
        p_Var1 = p_Var2;
      }
    }
    else {
      Station::modifyIntensityAperture_abi_cxx11_
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_a8
                 ,local_88,*(int *)((long)&p_Var8->_M_next + (long)local_74 * 4),-1.0);
      p_Var1 = local_c0.
               super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl._M_node.super__List_node_base._M_next;
      while (p_Var1 != (_List_node_base *)&local_c0) {
        p_Var2 = p_Var1->_M_next;
        operator_delete(p_Var1);
        p_Var1 = p_Var2;
      }
      local_c0.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node._M_size = 0;
      if (local_a8._M_next == &local_a8) {
        psVar6 = &local_c0.
                  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl._M_node._M_size;
        local_c0.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_c0;
        local_c0.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_c0;
      }
      else {
        psVar6 = local_98;
        (local_a8._M_prev)->_M_next = (_List_node_base *)&local_c0;
        (local_a8._M_next)->_M_prev = (_List_node_base *)&local_c0;
        local_c0.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node._M_size = local_98[0];
        local_c0.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_next = local_a8._M_next;
        local_c0.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_prev = local_a8._M_prev;
        local_a8._M_next = &local_a8;
        local_a8._M_prev = &local_a8;
      }
      *psVar6 = 0;
      p_Var1 = local_a8._M_next;
      while (p_Var1 != &local_a8) {
        p_Var2 = p_Var1->_M_next;
        operator_delete(p_Var1);
        p_Var1 = p_Var2;
      }
    }
    local_70 = Plan::incremental_eval(local_68,local_88,&local_c0);
  }
LAB_00124ec9:
  p_Var1 = local_c0.
           super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var8 != (_List_node_base *)0x0) {
    operator_delete(p_Var8);
    p_Var1 = local_c0.
             super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl._M_node.super__List_node_base._M_next;
  }
  while (p_Var1 != (_List_node_base *)&local_c0) {
    p_Var8 = p_Var1->_M_next;
    operator_delete(p_Var1);
    p_Var1 = p_Var8;
  }
  return local_70;
}

Assistant:

double ApertureILS::improvementIntensity(int beamlet, Station& station, bool open_beamlet, 
                                         double c_eval, Plan & P, bool best_improvement) {
  
  double local_best =-1, aux_eval=0;
  list<pair<int, double> > diff;
  int a, local_a, i;
  bool flag = true;
  vector<int> a_list;
  
  a_list = station.getOpen(beamlet);
  
  if (a_list.size()<1) {
    //cout << endl << "Warning: not possible to make intensity change beamlet:" << beamlet <<endl;
    cout << "[NOPT] ";
    return(c_eval);
  }
  
  a = (int)rand() % a_list.size();
  i=0;

  // Check every aperture 
  while(flag) {
    if (open_beamlet) {
      diff = station.modifyIntensityAperture(a_list[a], step_intensity);
      aux_eval = P.incremental_eval(station, diff);
      //cout << endl<<"  Increasing intensity aperture: " << a <<" eval: " << aux_eval << " list: ";
      //for (list<pair<int,double> >::iterator it=aux_diff.begin();it!=aux_diff.end();it++) cout << it->first << " ";
      //cout << endl;
    } else {
      diff = station.modifyIntensityAperture(a_list[a], -step_intensity);
      aux_eval = P.incremental_eval(station, diff);
      //cout << endl<< "  Reducing intensity aperture: " << a <<" eval: " << aux_eval <<  " list: ";
      //for (list<pair<int,double> >::iterator it=aux_diff.begin();it!=aux_diff.end();it++) cout << it->first << " ";
      //cout << endl;
    }
    
    // First improvement
    if (local_best < 0 || (local_best- aux_eval)>0.00001){
      local_best=aux_eval;
      local_a=a;
      i=0; // to support best improvement
      if (!best_improvement)
        return(local_best);
    } 
    
    //Undo change
    diff = station.undoLast();
    if (diff.size()>0)
      aux_eval = P.incremental_eval(station, diff);
    
    i++;
    a++;
    if (a==a_list.size()) a=0;
    if (i==a_list.size()) flag=false;
  }
  
  // If no improvement was found, return the best solution found.
  if (!open_beamlet) {
    diff = station.modifyIntensityAperture(a_list[local_a], 1);
    local_best = P.incremental_eval(station, diff);
  } else{
    diff = station.modifyIntensityAperture(a_list[local_a], -1);
    local_best = P.incremental_eval(station, diff);
  }
  return(local_best);
}